

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

int __thiscall soplex::SVSetBase<double>::remove(SVSetBase<double> *this,char *__filename)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)(this->set).thenum;
  if (0 < lVar2) {
    lVar2 = lVar2 + 1;
    do {
      if (*(int *)(__filename + lVar2 * 4 + -8) < 0) {
        deleteVec(this,&(this->set).theitem[(this->set).thekey[lVar2 + -2].idx].data);
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::remove(&this->set,__filename);
  return iVar1;
}

Assistant:

void remove(int perm[])
   {
      int j = num();

      /* due to performance reasons we use a backwards loop to delete entries, because it could result instead of only
       * decreasing the number of elements j times in memmoving the whole array j times
       */
      for(int i = j - 1; i >= 0; --i)
      {
         if(perm[i] < 0)
         {
            deleteVec(&set[i]);
         }
      }

      set.remove(perm);
   }